

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.hpp
# Opt level: O3

valarray<double> __thiscall
sciplot::linspace<float,float,double>(sciplot *this,float x0,float x1,size_t numintervals)

{
  undefined1 auVar1 [16];
  void *__s;
  ulong uVar2;
  double *extraout_RDX;
  double *pdVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  valarray<double> vVar11;
  
  *(size_t *)this = numintervals + 1;
  uVar2 = numintervals * 8 + 8;
  __s = operator_new(uVar2);
  *(void **)(this + 8) = __s;
  uVar4 = 0;
  memset(__s,0,uVar2);
  auVar1 = _DAT_00176120;
  auVar10._8_4_ = (int)(numintervals >> 0x20);
  auVar10._0_8_ = numintervals;
  auVar10._12_4_ = 0x45300000;
  dVar7 = (auVar10._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)numintervals) - 4503599627370496.0);
  lVar5 = numintervals + 1 + (ulong)(numintervals + 1 == 0);
  lVar6 = lVar5 + -1;
  auVar8._8_4_ = (int)lVar6;
  auVar8._0_8_ = lVar6;
  auVar8._12_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar8 = auVar8 ^ _DAT_00176120;
  pdVar3 = extraout_RDX;
  auVar9 = _DAT_00176110;
  do {
    auVar10 = auVar9 ^ auVar1;
    if ((bool)(~(auVar10._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar10._0_4_ ||
                auVar8._4_4_ < auVar10._4_4_) & 1)) {
      if ((long)uVar4 < 0) {
        pdVar3 = (double *)(uVar4 >> 1);
      }
      *(double *)((long)__s + uVar4 * 8) = (double)((float)uVar4 * (x1 - x0)) / dVar7 + (double)x0;
    }
    if ((auVar10._12_4_ != auVar8._12_4_ || auVar10._8_4_ <= auVar8._8_4_) &&
        auVar10._12_4_ <= auVar8._12_4_) {
      uVar2 = uVar4 + 1;
      if ((long)uVar2 < 0) {
        pdVar3 = (double *)(uVar2 >> 1);
      }
      *(double *)((long)__s + uVar4 * 8 + 8) =
           (double)((float)uVar2 * (x1 - x0)) / dVar7 + (double)x0;
    }
    uVar4 = uVar4 + 2;
    lVar6 = auVar9._8_8_;
    auVar9._0_8_ = auVar9._0_8_ + 2;
    auVar9._8_8_ = lVar6 + 2;
  } while ((lVar5 + 1U & 0xfffffffffffffffe) != uVar4);
  vVar11._M_data = pdVar3;
  vVar11._M_size = (size_t)this;
  return vVar11;
}

Assistant:

auto linspace(T0 x0, T1 x1, std::size_t numintervals) -> std::valarray<U>
{
    std::valarray<U> result(numintervals + 1);
    for(std::size_t i = 0; i <= numintervals; ++i)
        result[i] = x0 + i * (x1 - x0) / static_cast<U>(numintervals);
    return result;
}